

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDantzigLCP.cpp
# Opt level: O0

void __thiscall btLCP::unpermute(btLCP *this)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int *in_RDI;
  int j_1;
  int n_1;
  int *p_1;
  btScalar *tmp_1;
  btScalar *w;
  int j;
  int n;
  int *p;
  btScalar *tmp;
  btScalar *x;
  int local_48;
  int local_28;
  
  memcpy(*(void **)(in_RDI + 0x1a),*(void **)(in_RDI + 8),(long)*in_RDI << 2);
  lVar2 = *(long *)(in_RDI + 8);
  lVar3 = *(long *)(in_RDI + 0x1a);
  lVar4 = *(long *)(in_RDI + 0x20);
  iVar1 = *in_RDI;
  for (local_28 = 0; local_28 < iVar1; local_28 = local_28 + 1) {
    *(undefined4 *)(lVar2 + (long)*(int *)(lVar4 + (long)local_28 * 4) * 4) =
         *(undefined4 *)(lVar3 + (long)local_28 * 4);
  }
  memcpy(*(void **)(in_RDI + 0x1a),*(void **)(in_RDI + 0xc),(long)*in_RDI << 2);
  lVar2 = *(long *)(in_RDI + 0xc);
  lVar3 = *(long *)(in_RDI + 0x1a);
  lVar4 = *(long *)(in_RDI + 0x20);
  iVar1 = *in_RDI;
  for (local_48 = 0; local_48 < iVar1; local_48 = local_48 + 1) {
    *(undefined4 *)(lVar2 + (long)*(int *)(lVar4 + (long)local_48 * 4) * 4) =
         *(undefined4 *)(lVar3 + (long)local_48 * 4);
  }
  return;
}

Assistant:

void btLCP::unpermute()
{
  // now we have to un-permute x and w
  {
    memcpy (m_tmp,m_x,m_n*sizeof(btScalar));
    btScalar *x = m_x, *tmp = m_tmp;
    const int *p = m_p;
    const int n = m_n;
    for (int j=0; j<n; ++j) x[p[j]] = tmp[j];
  }
  {
    memcpy (m_tmp,m_w,m_n*sizeof(btScalar));
    btScalar *w = m_w, *tmp = m_tmp;
    const int *p = m_p;
    const int n = m_n;
    for (int j=0; j<n; ++j) w[p[j]] = tmp[j];
  }
}